

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

CFeeRate ParseFeeRate(UniValue *json)

{
  CFeeRate CVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CVar1.nSatoshisPerK = AmountFromValue(json,8);
  if (CVar1.nSatoshisPerK < 100000000) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (CFeeRate)CVar1.nSatoshisPerK;
    }
  }
  else {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Fee rates larger than or equal to 1BTC/kvB are not accepted","")
    ;
    JSONRPCError(__return_storage_ptr__,-8,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CFeeRate ParseFeeRate(const UniValue& json)
{
    CAmount val{AmountFromValue(json)};
    if (val >= COIN) throw JSONRPCError(RPC_INVALID_PARAMETER, "Fee rates larger than or equal to 1BTC/kvB are not accepted");
    return CFeeRate{val};
}